

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene_line_segments.h
# Opt level: O1

LBBox3fa * __thiscall
embree::avx512::LineSegmentsISA::vlinearBounds
          (LBBox3fa *__return_storage_ptr__,LineSegmentsISA *this,LinearSpace3fa *space,
          size_t primID,BBox1f *time_range)

{
  uint *puVar1;
  float fVar2;
  undefined4 uVar3;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar4;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar5;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar6;
  BufferView<embree::Vec3fx> *pBVar7;
  char *pcVar8;
  size_t sVar9;
  float fVar10;
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  uint uVar35;
  ulong uVar36;
  size_t *psVar37;
  int iVar38;
  int iVar39;
  uint uVar40;
  int iVar41;
  long lVar42;
  ulong uVar43;
  long lVar44;
  long lVar45;
  long lVar46;
  long in_GS_OFFSET;
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [16];
  undefined1 auVar52 [16];
  undefined1 auVar53 [16];
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  longdouble in_ST0;
  float fVar61;
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar73;
  float fVar77;
  float fVar78;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  float fVar79;
  anon_union_16_2_47237d3f_for_Vec3fa_0 aVar76;
  undefined1 auVar80 [16];
  undefined1 auVar81 [16];
  float fVar82;
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 in_ZMM17 [64];
  
  fVar2 = (this->super_LineSegments).super_Geometry.fnumTimeSegments;
  fVar61 = (this->super_LineSegments).super_Geometry.time_range.lower;
  fVar82 = time_range->upper;
  auVar48 = ZEXT416((uint)((this->super_LineSegments).super_Geometry.time_range.upper - fVar61));
  auVar47 = vdivss_avx512f(ZEXT416((uint)(time_range->lower - fVar61)),auVar48);
  auVar48 = vdivss_avx512f(ZEXT416((uint)(fVar82 - fVar61)),auVar48);
  auVar49 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar47);
  auVar50 = vmulss_avx512f(ZEXT416((uint)fVar2),auVar48);
  auVar51 = vrndscaless_avx512f(auVar49,auVar49);
  puVar1 = (uint *)((long)&space[-2].vy.field_0.field_1.x + 3);
  *puVar1 = *puVar1 | (uint)&stack0xffffffffffffffe0;
  pcVar8 = (char *)((long)&(space->vx).field_0 + in_GS_OFFSET);
  *pcVar8 = *pcVar8 + (char)primID;
  (space->vx).field_0.m128[0] = (float)(int)in_ST0;
  auVar52 = vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
  auVar53 = vmaxss_avx512f(auVar51,auVar52);
  auVar68 = ZEXT416((uint)fVar2);
  auVar54 = vminss_avx512f(ZEXT416((uint)fVar82),auVar68);
  iVar38 = vcvttss2si_avx512f(auVar54);
  iVar39 = -1;
  if (-1 < (int)auVar51._0_4_) {
    iVar39 = (int)auVar51._0_4_;
  }
  iVar41 = vcvttss2si_avx512f(auVar68);
  uVar35 = iVar41 + 1U;
  if ((int)fVar82 < (int)(iVar41 + 1U)) {
    uVar35 = (int)fVar82;
  }
  lVar42 = (long)(int)auVar53._0_4_;
  uVar40 = *(uint *)(*(long *)&(this->super_LineSegments).super_Geometry.field_0x58 +
                    primID * *(long *)&(this->super_LineSegments).field_0x68);
  uVar36 = (ulong)uVar40;
  pBVar7 = (this->super_LineSegments).vertices.items;
  pcVar8 = pBVar7[lVar42].super_RawBufferView.ptr_ofs;
  sVar9 = pBVar7[lVar42].super_RawBufferView.stride;
  lVar44 = sVar9 * uVar36;
  uVar43 = (ulong)(uVar40 + 1);
  lVar46 = sVar9 * uVar43;
  aVar4 = (space->vx).field_0;
  aVar5 = (space->vy).field_0;
  aVar6 = (space->vz).field_0;
  uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 8);
  auVar51._4_4_ = uVar3;
  auVar51._0_4_ = uVar3;
  auVar51._8_4_ = uVar3;
  auVar51._12_4_ = uVar3;
  auVar51 = vmulps_avx512vl((undefined1  [16])aVar6,auVar51);
  uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 4);
  auVar55._4_4_ = uVar3;
  auVar55._0_4_ = uVar3;
  auVar55._8_4_ = uVar3;
  auVar55._12_4_ = uVar3;
  auVar51 = vfmadd231ps_avx512vl(auVar51,(undefined1  [16])aVar5,auVar55);
  uVar3 = *(undefined4 *)(pcVar8 + lVar44);
  auVar56._4_4_ = uVar3;
  auVar56._0_4_ = uVar3;
  auVar56._8_4_ = uVar3;
  auVar56._12_4_ = uVar3;
  auVar51 = vfmadd231ps_avx512vl(auVar51,(undefined1  [16])aVar4,auVar56);
  uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 0xc);
  auVar67._4_4_ = uVar3;
  auVar67._0_4_ = uVar3;
  auVar67._8_4_ = uVar3;
  auVar67._12_4_ = uVar3;
  uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 8);
  auVar57._4_4_ = uVar3;
  auVar57._0_4_ = uVar3;
  auVar57._8_4_ = uVar3;
  auVar57._12_4_ = uVar3;
  auVar55 = vmulps_avx512vl((undefined1  [16])aVar6,auVar57);
  uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 4);
  auVar58._4_4_ = uVar3;
  auVar58._0_4_ = uVar3;
  auVar58._8_4_ = uVar3;
  auVar58._12_4_ = uVar3;
  auVar55 = vfmadd231ps_avx512vl(auVar55,(undefined1  [16])aVar5,auVar58);
  auVar51 = vblendps_avx(auVar51,auVar67,8);
  uVar3 = *(undefined4 *)(pcVar8 + lVar46);
  auVar59._4_4_ = uVar3;
  auVar59._0_4_ = uVar3;
  auVar59._8_4_ = uVar3;
  auVar59._12_4_ = uVar3;
  auVar55 = vfmadd231ps_avx512vl(auVar55,(undefined1  [16])aVar4,auVar59);
  uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 0xc);
  auVar74._4_4_ = uVar3;
  auVar74._0_4_ = uVar3;
  auVar74._8_4_ = uVar3;
  auVar74._12_4_ = uVar3;
  auVar55 = vblendps_avx(auVar55,auVar74,8);
  auVar56 = vminps_avx512vl(auVar51,auVar55);
  auVar51 = vmaxps_avx(auVar51,auVar55);
  fVar2 = (this->super_LineSegments).maxRadiusScale;
  auVar55 = vmaxss_avx(auVar74,auVar67);
  fVar61 = fVar2 * auVar55._0_4_;
  auVar71._4_4_ = fVar61;
  auVar71._0_4_ = fVar61;
  auVar71._8_4_ = fVar61;
  auVar71._12_4_ = fVar61;
  auVar56 = vsubps_avx512vl(auVar56,auVar71);
  auVar66._0_4_ = auVar51._0_4_ + fVar61;
  auVar66._4_4_ = auVar51._4_4_ + fVar61;
  auVar66._8_4_ = auVar51._8_4_ + fVar61;
  auVar66._12_4_ = auVar51._12_4_ + fVar61;
  lVar44 = (long)iVar38;
  pcVar8 = pBVar7[lVar44].super_RawBufferView.ptr_ofs;
  sVar9 = pBVar7[lVar44].super_RawBufferView.stride;
  lVar45 = sVar9 * uVar36;
  uVar3 = *(undefined4 *)(pcVar8 + lVar45 + 8);
  auVar60._4_4_ = uVar3;
  auVar60._0_4_ = uVar3;
  auVar60._8_4_ = uVar3;
  auVar60._12_4_ = uVar3;
  auVar51 = vmulps_avx512vl((undefined1  [16])aVar6,auVar60);
  uVar3 = *(undefined4 *)(pcVar8 + lVar45 + 4);
  auVar12._4_4_ = uVar3;
  auVar12._0_4_ = uVar3;
  auVar12._8_4_ = uVar3;
  auVar12._12_4_ = uVar3;
  auVar51 = vfmadd231ps_avx512vl(auVar51,(undefined1  [16])aVar5,auVar12);
  lVar46 = sVar9 * uVar43;
  uVar3 = *(undefined4 *)(pcVar8 + lVar45);
  auVar13._4_4_ = uVar3;
  auVar13._0_4_ = uVar3;
  auVar13._8_4_ = uVar3;
  auVar13._12_4_ = uVar3;
  auVar51 = vfmadd231ps_avx512vl(auVar51,(undefined1  [16])aVar4,auVar13);
  uVar3 = *(undefined4 *)(pcVar8 + lVar45 + 0xc);
  auVar75._4_4_ = uVar3;
  auVar75._0_4_ = uVar3;
  auVar75._8_4_ = uVar3;
  auVar75._12_4_ = uVar3;
  auVar51 = vblendps_avx(auVar51,auVar75,8);
  uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 8);
  auVar14._4_4_ = uVar3;
  auVar14._0_4_ = uVar3;
  auVar14._8_4_ = uVar3;
  auVar14._12_4_ = uVar3;
  auVar55 = vmulps_avx512vl((undefined1  [16])aVar6,auVar14);
  uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 4);
  auVar15._4_4_ = uVar3;
  auVar15._0_4_ = uVar3;
  auVar15._8_4_ = uVar3;
  auVar15._12_4_ = uVar3;
  auVar55 = vfmadd231ps_avx512vl(auVar55,(undefined1  [16])aVar5,auVar15);
  uVar3 = *(undefined4 *)(pcVar8 + lVar46);
  auVar16._4_4_ = uVar3;
  auVar16._0_4_ = uVar3;
  auVar16._8_4_ = uVar3;
  auVar16._12_4_ = uVar3;
  auVar55 = vfmadd231ps_avx512vl(auVar55,(undefined1  [16])aVar4,auVar16);
  uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 0xc);
  auVar80._4_4_ = uVar3;
  auVar80._0_4_ = uVar3;
  auVar80._8_4_ = uVar3;
  auVar80._12_4_ = uVar3;
  auVar55 = vblendps_avx(auVar55,auVar80,8);
  auVar57 = vminps_avx512vl(auVar51,auVar55);
  auVar51 = vmaxps_avx(auVar51,auVar55);
  auVar55 = vmaxss_avx(auVar80,auVar75);
  fVar61 = fVar2 * auVar55._0_4_;
  auVar81._4_4_ = fVar61;
  auVar81._0_4_ = fVar61;
  auVar81._8_4_ = fVar61;
  auVar81._12_4_ = fVar61;
  auVar55 = vsubps_avx512vl(auVar57,auVar81);
  auVar72._0_4_ = fVar61 + auVar51._0_4_;
  auVar72._4_4_ = fVar61 + auVar51._4_4_;
  auVar72._8_4_ = fVar61 + auVar51._8_4_;
  auVar72._12_4_ = fVar61 + auVar51._12_4_;
  if (uVar35 - iVar39 == 1) {
    auVar47 = vsubss_avx512f(auVar49,auVar53);
    auVar47 = vmaxss_avx512f(auVar47,auVar52);
    fVar61 = auVar47._0_4_;
    fVar2 = 1.0 - fVar61;
    auVar70._0_4_ = auVar55._0_4_ * fVar61;
    auVar70._4_4_ = auVar55._4_4_ * fVar61;
    auVar70._8_4_ = auVar55._8_4_ * fVar61;
    auVar70._12_4_ = auVar55._12_4_ * fVar61;
    auVar69._4_4_ = fVar2;
    auVar69._0_4_ = fVar2;
    auVar69._8_4_ = fVar2;
    auVar69._12_4_ = fVar2;
    aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar70,auVar69,auVar56);
    auVar47._0_4_ = fVar61 * auVar72._0_4_;
    auVar47._4_4_ = fVar61 * auVar72._4_4_;
    auVar47._8_4_ = fVar61 * auVar72._8_4_;
    auVar47._12_4_ = fVar61 * auVar72._12_4_;
    (__return_storage_ptr__->bounds0).lower.field_0 = aVar4;
    aVar4 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd231ps_fma(auVar47,auVar66,auVar69);
    (__return_storage_ptr__->bounds0).upper.field_0 = aVar4;
    auVar47 = vsubss_avx512f(auVar54,auVar50);
    auVar47 = vmaxss_avx512f(auVar47,auVar52);
    fVar61 = auVar47._0_4_;
    fVar2 = 1.0 - fVar61;
    auVar68._0_4_ = fVar61 * auVar56._0_4_;
    auVar68._4_4_ = fVar61 * auVar56._4_4_;
    auVar68._8_4_ = fVar61 * auVar56._8_4_;
    auVar68._12_4_ = fVar61 * auVar56._12_4_;
    auVar52._4_4_ = fVar2;
    auVar52._0_4_ = fVar2;
    auVar52._8_4_ = fVar2;
    auVar52._12_4_ = fVar2;
    aVar76 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar55,auVar52,auVar68);
    auVar48._0_4_ = fVar61 * auVar66._0_4_;
    auVar48._4_4_ = fVar61 * auVar66._4_4_;
    auVar48._8_4_ = fVar61 * auVar66._8_4_;
    auVar48._12_4_ = fVar61 * auVar66._12_4_;
    aVar73 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar72,auVar52,auVar48);
  }
  else {
    pcVar8 = pBVar7[lVar42 + 1].super_RawBufferView.ptr_ofs;
    sVar9 = pBVar7[lVar42 + 1].super_RawBufferView.stride;
    lVar46 = sVar9 * uVar36;
    lVar42 = sVar9 * uVar43;
    uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 8);
    auVar17._4_4_ = uVar3;
    auVar17._0_4_ = uVar3;
    auVar17._8_4_ = uVar3;
    auVar17._12_4_ = uVar3;
    auVar51 = vmulps_avx512vl((undefined1  [16])aVar6,auVar17);
    uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 4);
    auVar18._4_4_ = uVar3;
    auVar18._0_4_ = uVar3;
    auVar18._8_4_ = uVar3;
    auVar18._12_4_ = uVar3;
    auVar51 = vfmadd231ps_avx512vl(auVar51,(undefined1  [16])aVar5,auVar18);
    uVar3 = *(undefined4 *)(pcVar8 + lVar46);
    auVar19._4_4_ = uVar3;
    auVar19._0_4_ = uVar3;
    auVar19._8_4_ = uVar3;
    auVar19._12_4_ = uVar3;
    auVar51 = vfmadd231ps_avx512vl(auVar51,(undefined1  [16])aVar4,auVar19);
    uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 0xc);
    auVar86._4_4_ = uVar3;
    auVar86._0_4_ = uVar3;
    auVar86._8_4_ = uVar3;
    auVar86._12_4_ = uVar3;
    uVar3 = *(undefined4 *)(pcVar8 + lVar42 + 8);
    auVar20._4_4_ = uVar3;
    auVar20._0_4_ = uVar3;
    auVar20._8_4_ = uVar3;
    auVar20._12_4_ = uVar3;
    auVar57 = vmulps_avx512vl((undefined1  [16])aVar6,auVar20);
    uVar3 = *(undefined4 *)(pcVar8 + lVar42 + 4);
    auVar21._4_4_ = uVar3;
    auVar21._0_4_ = uVar3;
    auVar21._8_4_ = uVar3;
    auVar21._12_4_ = uVar3;
    auVar57 = vfmadd231ps_avx512vl(auVar57,(undefined1  [16])aVar5,auVar21);
    uVar3 = *(undefined4 *)(pcVar8 + lVar42);
    auVar22._4_4_ = uVar3;
    auVar22._0_4_ = uVar3;
    auVar22._8_4_ = uVar3;
    auVar22._12_4_ = uVar3;
    auVar57 = vfmadd231ps_avx512vl(auVar57,(undefined1  [16])aVar4,auVar22);
    uVar3 = *(undefined4 *)(pcVar8 + lVar42 + 0xc);
    auVar90._4_4_ = uVar3;
    auVar90._0_4_ = uVar3;
    auVar90._8_4_ = uVar3;
    auVar90._12_4_ = uVar3;
    auVar51 = vblendps_avx(auVar51,auVar86,8);
    auVar57 = vblendps_avx(auVar57,auVar90,8);
    auVar58 = vminps_avx512vl(auVar51,auVar57);
    auVar51 = vmaxps_avx(auVar51,auVar57);
    auVar57 = vmaxss_avx(auVar90,auVar86);
    fVar61 = fVar2 * auVar57._0_4_;
    auVar83._4_4_ = fVar61;
    auVar83._0_4_ = fVar61;
    auVar83._8_4_ = fVar61;
    auVar83._12_4_ = fVar61;
    auVar58 = vsubps_avx512vl(auVar58,auVar83);
    auVar59 = vaddps_avx512vl(auVar51,auVar83);
    pcVar8 = pBVar7[lVar44 + -1].super_RawBufferView.ptr_ofs;
    sVar9 = pBVar7[lVar44 + -1].super_RawBufferView.stride;
    lVar46 = sVar9 * uVar36;
    uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 8);
    auVar23._4_4_ = uVar3;
    auVar23._0_4_ = uVar3;
    auVar23._8_4_ = uVar3;
    auVar23._12_4_ = uVar3;
    auVar51 = vmulps_avx512vl((undefined1  [16])aVar6,auVar23);
    uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 4);
    auVar24._4_4_ = uVar3;
    auVar24._0_4_ = uVar3;
    auVar24._8_4_ = uVar3;
    auVar24._12_4_ = uVar3;
    auVar51 = vfmadd231ps_avx512vl(auVar51,(undefined1  [16])aVar5,auVar24);
    uVar3 = *(undefined4 *)(pcVar8 + lVar46);
    auVar25._4_4_ = uVar3;
    auVar25._0_4_ = uVar3;
    auVar25._8_4_ = uVar3;
    auVar25._12_4_ = uVar3;
    auVar51 = vfmadd231ps_avx512vl(auVar51,(undefined1  [16])aVar4,auVar25);
    lVar44 = sVar9 * uVar43;
    uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 0xc);
    auVar91._4_4_ = uVar3;
    auVar91._0_4_ = uVar3;
    auVar91._8_4_ = uVar3;
    auVar91._12_4_ = uVar3;
    auVar51 = vblendps_avx(auVar51,auVar91,8);
    uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 8);
    auVar26._4_4_ = uVar3;
    auVar26._0_4_ = uVar3;
    auVar26._8_4_ = uVar3;
    auVar26._12_4_ = uVar3;
    auVar57 = vmulps_avx512vl((undefined1  [16])aVar6,auVar26);
    uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 4);
    auVar27._4_4_ = uVar3;
    auVar27._0_4_ = uVar3;
    auVar27._8_4_ = uVar3;
    auVar27._12_4_ = uVar3;
    auVar57 = vfmadd231ps_avx512vl(auVar57,(undefined1  [16])aVar5,auVar27);
    uVar3 = *(undefined4 *)(pcVar8 + lVar44);
    auVar28._4_4_ = uVar3;
    auVar28._0_4_ = uVar3;
    auVar28._8_4_ = uVar3;
    auVar28._12_4_ = uVar3;
    auVar57 = vfmadd231ps_avx512vl(auVar57,(undefined1  [16])aVar4,auVar28);
    uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 0xc);
    auVar94._4_4_ = uVar3;
    auVar94._0_4_ = uVar3;
    auVar94._8_4_ = uVar3;
    auVar94._12_4_ = uVar3;
    auVar57 = vblendps_avx(auVar57,auVar94,8);
    auVar60 = vminps_avx512vl(auVar51,auVar57);
    auVar51 = vmaxps_avx(auVar51,auVar57);
    auVar57 = vmaxss_avx(auVar94,auVar91);
    fVar61 = fVar2 * auVar57._0_4_;
    auVar84._4_4_ = fVar61;
    auVar84._0_4_ = fVar61;
    auVar84._8_4_ = fVar61;
    auVar84._12_4_ = fVar61;
    auVar57 = vsubps_avx512vl(auVar60,auVar84);
    auVar49 = vsubss_avx512f(auVar49,auVar53);
    auVar49 = vmaxss_avx512f(auVar49,auVar52);
    auVar53 = vsubss_avx512f(ZEXT416(0x3f800000),auVar49);
    auVar85._0_4_ = auVar49._0_4_;
    auVar85._4_4_ = auVar85._0_4_;
    auVar85._8_4_ = auVar85._0_4_;
    auVar85._12_4_ = auVar85._0_4_;
    auVar87._0_4_ = auVar85._0_4_ * auVar58._0_4_;
    auVar87._4_4_ = auVar85._0_4_ * auVar58._4_4_;
    auVar87._8_4_ = auVar85._0_4_ * auVar58._8_4_;
    auVar87._12_4_ = auVar85._0_4_ * auVar58._12_4_;
    auVar95._0_4_ = auVar53._0_4_;
    auVar95._4_4_ = auVar95._0_4_;
    auVar95._8_4_ = auVar95._0_4_;
    auVar95._12_4_ = auVar95._0_4_;
    auVar49 = vfmadd213ps_fma(auVar56,auVar95,auVar87);
    auVar53 = vmulps_avx512vl(auVar85,auVar59);
    auVar53 = vfmadd213ps_fma(auVar66,auVar95,auVar53);
    auVar50 = vsubss_avx512f(auVar54,auVar50);
    auVar50 = vmaxss_avx512f(auVar50,auVar52);
    auVar54 = vsubss_avx512f(ZEXT416(0x3f800000),auVar50);
    fVar82 = auVar50._0_4_;
    auVar92._0_4_ = fVar82 * auVar57._0_4_;
    auVar92._4_4_ = fVar82 * auVar57._4_4_;
    auVar92._8_4_ = fVar82 * auVar57._8_4_;
    auVar92._12_4_ = fVar82 * auVar57._12_4_;
    auVar54._4_4_ = auVar54._0_4_;
    auVar54._8_4_ = auVar54._0_4_;
    auVar54._12_4_ = auVar54._0_4_;
    aVar76 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar55,auVar54,auVar92);
    auVar50._0_4_ = fVar82 * (auVar51._0_4_ + fVar61);
    auVar50._4_4_ = fVar82 * (auVar51._4_4_ + fVar61);
    auVar50._8_4_ = fVar82 * (auVar51._8_4_ + fVar61);
    auVar50._12_4_ = fVar82 * (auVar51._12_4_ + fVar61);
    aVar73 = (anon_union_16_2_47237d3f_for_Vec3fa_0)vfmadd213ps_fma(auVar72,auVar54,auVar50);
    uVar40 = iVar39 + 1;
    if ((int)uVar40 < (int)uVar35) {
      auVar51 = vsubss_avx512f(auVar48,auVar47);
      psVar37 = &pBVar7[uVar40].super_RawBufferView.stride;
      auVar48 = auVar53;
      auVar50 = auVar49;
      do {
        auVar49 = vcvtsi2ss_avx512f(auVar52,uVar40);
        auVar49 = vdivss_avx512f(auVar49,auVar68);
        auVar49 = vsubss_avx512f(auVar49,auVar47);
        auVar88._0_4_ = auVar49._0_4_ / auVar51._0_4_;
        auVar88._4_12_ = auVar49._4_12_;
        auVar49 = vsubss_avx512f(ZEXT416(0x3f800000),auVar88);
        auVar96._0_4_ = aVar76.m128[0] * auVar88._0_4_;
        fVar77 = aVar76.m128[1];
        auVar96._4_4_ = fVar77 * auVar88._0_4_;
        fVar78 = aVar76.m128[2];
        auVar96._8_4_ = fVar78 * auVar88._0_4_;
        fVar79 = aVar76.m128[3];
        auVar96._12_4_ = fVar79 * auVar88._0_4_;
        auVar93._0_4_ = auVar49._0_4_;
        auVar93._4_4_ = auVar93._0_4_;
        auVar93._8_4_ = auVar93._0_4_;
        auVar93._12_4_ = auVar93._0_4_;
        auVar54 = vfmadd231ps_fma(auVar96,auVar93,auVar50);
        auVar89._0_4_ = auVar88._0_4_ * aVar73.m128[0];
        fVar61 = aVar73.m128[1];
        auVar89._4_4_ = auVar88._0_4_ * fVar61;
        fVar82 = aVar73.m128[2];
        auVar89._8_4_ = auVar88._0_4_ * fVar82;
        fVar10 = aVar73.m128[3];
        auVar89._12_4_ = auVar88._0_4_ * fVar10;
        auVar55 = vfmadd231ps_fma(auVar89,auVar48,auVar93);
        pcVar8 = ((RawBufferView *)(psVar37 + -2))->ptr_ofs;
        lVar46 = *psVar37 * uVar36;
        lVar44 = *psVar37 * uVar43;
        uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 8);
        auVar29._4_4_ = uVar3;
        auVar29._0_4_ = uVar3;
        auVar29._8_4_ = uVar3;
        auVar29._12_4_ = uVar3;
        auVar49 = vmulps_avx512vl((undefined1  [16])aVar6,auVar29);
        uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 4);
        auVar30._4_4_ = uVar3;
        auVar30._0_4_ = uVar3;
        auVar30._8_4_ = uVar3;
        auVar30._12_4_ = uVar3;
        auVar49 = vfmadd231ps_avx512vl(auVar49,(undefined1  [16])aVar5,auVar30);
        uVar3 = *(undefined4 *)(pcVar8 + lVar46);
        auVar31._4_4_ = uVar3;
        auVar31._0_4_ = uVar3;
        auVar31._8_4_ = uVar3;
        auVar31._12_4_ = uVar3;
        auVar49 = vfmadd231ps_avx512vl(auVar49,(undefined1  [16])aVar4,auVar31);
        uVar3 = *(undefined4 *)(pcVar8 + lVar46 + 0xc);
        auVar65._4_4_ = uVar3;
        auVar65._0_4_ = uVar3;
        auVar65._8_4_ = uVar3;
        auVar65._12_4_ = uVar3;
        uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 8);
        auVar32._4_4_ = uVar3;
        auVar32._0_4_ = uVar3;
        auVar32._8_4_ = uVar3;
        auVar32._12_4_ = uVar3;
        auVar53 = vmulps_avx512vl((undefined1  [16])aVar6,auVar32);
        uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 4);
        auVar33._4_4_ = uVar3;
        auVar33._0_4_ = uVar3;
        auVar33._8_4_ = uVar3;
        auVar33._12_4_ = uVar3;
        auVar53 = vfmadd231ps_avx512vl(auVar53,(undefined1  [16])aVar5,auVar33);
        auVar49 = vblendps_avx(auVar49,auVar65,8);
        uVar3 = *(undefined4 *)(pcVar8 + lVar44);
        auVar34._4_4_ = uVar3;
        auVar34._0_4_ = uVar3;
        auVar34._8_4_ = uVar3;
        auVar34._12_4_ = uVar3;
        auVar53 = vfmadd231ps_avx512vl(auVar53,(undefined1  [16])aVar4,auVar34);
        uVar3 = *(undefined4 *)(pcVar8 + lVar44 + 0xc);
        auVar62._4_4_ = uVar3;
        auVar62._0_4_ = uVar3;
        auVar62._8_4_ = uVar3;
        auVar62._12_4_ = uVar3;
        auVar53 = vblendps_avx(auVar53,auVar62,8);
        auVar56 = vminps_avx512vl(auVar49,auVar53);
        auVar49 = vmaxps_avx(auVar49,auVar53);
        auVar53 = vmaxss_avx(auVar62,auVar65);
        fVar11 = fVar2 * auVar53._0_4_;
        auVar63._4_4_ = fVar11;
        auVar63._0_4_ = fVar11;
        auVar63._8_4_ = fVar11;
        auVar63._12_4_ = fVar11;
        auVar53 = vsubps_avx512vl(auVar56,auVar63);
        auVar53 = vsubps_avx(auVar53,auVar54);
        auVar64._0_4_ = auVar49._0_4_ + fVar11;
        auVar64._4_4_ = auVar49._4_4_ + fVar11;
        auVar64._8_4_ = auVar49._8_4_ + fVar11;
        auVar64._12_4_ = auVar49._12_4_ + fVar11;
        auVar49 = vsubps_avx(auVar64,auVar55);
        auVar53 = vminps_avx(auVar53,ZEXT416(0) << 0x20);
        auVar54 = vmaxps_avx(auVar49,ZEXT416(0) << 0x20);
        auVar49._0_4_ = auVar50._0_4_ + auVar53._0_4_;
        auVar49._4_4_ = auVar50._4_4_ + auVar53._4_4_;
        auVar49._8_4_ = auVar50._8_4_ + auVar53._8_4_;
        auVar49._12_4_ = auVar50._12_4_ + auVar53._12_4_;
        aVar76._0_4_ = aVar76.m128[0] + auVar53._0_4_;
        aVar76._4_4_ = fVar77 + auVar53._4_4_;
        aVar76._8_4_ = fVar78 + auVar53._8_4_;
        aVar76._12_4_ = fVar79 + auVar53._12_4_;
        auVar53._0_4_ = auVar48._0_4_ + auVar54._0_4_;
        auVar53._4_4_ = auVar48._4_4_ + auVar54._4_4_;
        auVar53._8_4_ = auVar48._8_4_ + auVar54._8_4_;
        auVar53._12_4_ = auVar48._12_4_ + auVar54._12_4_;
        aVar73._0_4_ = aVar73.m128[0] + auVar54._0_4_;
        aVar73._4_4_ = fVar61 + auVar54._4_4_;
        aVar73._8_4_ = fVar82 + auVar54._8_4_;
        aVar73._12_4_ = fVar10 + auVar54._12_4_;
        uVar40 = uVar40 + 1;
        psVar37 = psVar37 + 7;
        auVar48 = auVar53;
        auVar50 = auVar49;
      } while (uVar35 != uVar40);
    }
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).lower.field_0.m128 = auVar49;
    *(undefined1 (*) [16])(__return_storage_ptr__->bounds0).upper.field_0.m128 = auVar53;
  }
  (__return_storage_ptr__->bounds1).lower.field_0 = aVar76;
  (__return_storage_ptr__->bounds1).upper.field_0 = aVar73;
  return __return_storage_ptr__;
}

Assistant:

LBBox3fa vlinearBounds(const LinearSpace3fa& space, size_t primID, const BBox1f& time_range) const {
        return linearBounds(space,primID,time_range);
      }